

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O1

bool QFontDatabase::removeApplicationFallbackFontFamily(Script script,QString *familyName)

{
  QDebug this;
  bool bVar1;
  Type *pTVar2;
  ExtendedScript script_00;
  undefined4 in_register_0000003c;
  long in_FS_OFFSET;
  QDeadlineTimer QVar3;
  QByteArrayView QVar4;
  QDebug local_50;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                       *)CONCAT44(in_register_0000003c,script));
  if (pTVar2 != (Type *)0x0) {
    QVar3.t2 = 0xffffffff;
    QVar3.type = 0x7fffffff;
    QVar3.t1 = (qint64)pTVar2;
    QRecursiveMutex::tryLock(QVar3);
  }
  if (script - ScriptCount < 0xffffff57) {
    QtPrivateLogging::lcFontDb();
    if (((byte)QtPrivateLogging::lcFontDb::category.field_2.bools.enabledWarning._q_value._M_base.
               _M_i & 1) != 0) {
      QMessageLogger::warning();
      this.stream = local_50.stream;
      QVar4.m_data = (storage_type *)0x3d;
      QVar4.m_size = (qsizetype)&local_48;
      QString::fromUtf8(QVar4);
      QTextStream::operator<<(&(this.stream)->ts,&local_48);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((local_50.stream)->space == true) {
        QTextStream::operator<<(&(local_50.stream)->ts,' ');
      }
      QTextStream::operator<<(&(local_50.stream)->ts,script);
      if ((local_50.stream)->space == true) {
        QTextStream::operator<<(&(local_50.stream)->ts,' ');
      }
      QDebug::~QDebug(&local_50);
    }
    bVar1 = false;
  }
  else {
    script_00 = Script_Common;
    if (script != Script_Latin) {
      script_00 = script;
    }
    QFontDatabasePrivate::instance();
    bVar1 = QFontDatabasePrivate::removeApplicationFallbackFontFamily
                      (&QFontDatabasePrivate::instance::instance,script_00,familyName);
  }
  if (pTVar2 != (Type *)0x0) {
    QRecursiveMutex::unlock();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFontDatabase::removeApplicationFallbackFontFamily(QChar::Script script, const QString &familyName)
{
    QMutexLocker locker(fontDatabaseMutex());

    if (script < QChar::Script_Common || script >= QChar::ScriptCount) {
        qCWarning(lcFontDb) << "Invalid script passed to removeApplicationFallbackFontFamily:" << script;
        return false;
    }

    if (script == QChar::Script_Latin)
        script = QChar::Script_Common;

    auto *db = QFontDatabasePrivate::instance();
    return db->removeApplicationFallbackFontFamily(QFontDatabasePrivate::ExtendedScript(script),
                                                   familyName);
}